

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_command.cpp
# Opt level: O2

void __thiscall Command::invoke(Command *this)

{
  if (this->action == Withdraw) {
    BankAccount::withdraw((this->bank_account)._M_data,this->amount);
    return;
  }
  if (this->action == Deposit) {
    BankAccount::deposit((this->bank_account)._M_data,this->amount);
    return;
  }
  return;
}

Assistant:

void invoke() const override
	{
		switch(action)
		{
		case Action::Deposit:
			bank_account.get().deposit(amount);
			break;
		case Action::Withdraw:
			bank_account.get().withdraw(amount);
			break;
		default:
			break;
		};
	}